

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

int ingrouping(lys_node *node)

{
  lys_node *iter;
  
  if (node != (lys_node *)0x0) {
    do {
      if (node->nodetype == LYS_EXT) {
        if (node->padding[1] != '\x01') {
          return 0;
        }
        node = (lys_node *)node->dsc;
      }
      else {
        if (node->nodetype == LYS_GROUPING) {
          return 1;
        }
        node = node->parent;
        if (node == (lys_node *)0x0) {
          return 0;
        }
      }
      if (node->nodetype == LYS_AUGMENT) {
        node = node->prev;
      }
    } while (node != (lys_node *)0x0);
  }
  return 0;
}

Assistant:

static int
ingrouping(const struct lys_node *node)
{
    const struct lys_node *iter = node;
    assert(node);

    for(iter = node; iter && iter->nodetype != LYS_GROUPING; iter = lys_parent(iter));
    if (!iter) {
        return 0;
    } else {
        return 1;
    }
}